

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O0

int string_to_number(char *string,intmax_t *numberp)

{
  intmax_t iVar1;
  int *piVar2;
  intmax_t *local_28;
  char *end;
  intmax_t *numberp_local;
  char *string_local;
  
  if ((string != (char *)0x0) && (*string != '\0')) {
    end = (char *)numberp;
    numberp_local = (intmax_t *)string;
    iVar1 = strtoimax(string,(char **)&local_28,10);
    *(intmax_t *)end = iVar1;
    if ((local_28 != numberp_local) &&
       (((char)*local_28 == '\0' && (piVar2 = __errno_location(), *piVar2 != 0x4b)))) {
      return 0;
    }
    end[0] = '\0';
    end[1] = '\0';
    end[2] = '\0';
    end[3] = '\0';
    end[4] = '\0';
    end[5] = '\0';
    end[6] = '\0';
    end[7] = '\0';
  }
  return -0x14;
}

Assistant:

static int
string_to_number(const char *string, intmax_t *numberp)
{
	char *end;

	if (string == NULL || *string == '\0')
		return (ARCHIVE_WARN);
	*numberp = strtoimax(string, &end, 10);
	if (end == string || *end != '\0' || errno == EOVERFLOW) {
		*numberp = 0;
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
}